

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcSpsUnit::short_term_ref_pic_set(HevcSpsUnit *this,uint stRpsIdx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  bool local_4d;
  bool local_39;
  uint local_38;
  uint i;
  bool use_delta_flag;
  bool used;
  uint j;
  uint delta_idx_minus1;
  uint refRpsIdx;
  bool inter_ref_pic_set_prediction_flag;
  uint numDeltaPocs;
  uint stRpsIdx_local;
  HevcSpsUnit *this_local;
  
  refRpsIdx = 0;
  local_39 = false;
  if (stRpsIdx != 0) {
    local_39 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  }
  if (local_39 == false) {
    uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    refRpsIdx = uVar2 + uVar3;
    if (0x40 < refRpsIdx) {
      return 1;
    }
    for (local_38 = 0; local_38 < refRpsIdx; local_38 = local_38 + 1) {
      uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
      if (0x7fff < uVar2) {
        return 1;
      }
      BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
    }
  }
  else {
    j = stRpsIdx - 1;
    if (stRpsIdx == this->num_short_term_ref_pic_sets) {
      uVar2 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
      if (stRpsIdx <= uVar2) {
        return 1;
      }
      j = j - uVar2;
    }
    BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
    HevcUnit::extractUEGolombCode((HevcUnit *)this);
    for (i = 0; pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   (&this->num_delta_pocs,(ulong)j), i <= *pvVar4; i = i + 1) {
      bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      if (bVar1) {
        local_4d = true;
      }
      else {
        local_4d = BitStreamReader::getBit
                             (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
      }
      if (local_4d != false) {
        refRpsIdx = refRpsIdx + 1;
      }
    }
  }
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->num_delta_pocs,(ulong)stRpsIdx);
  *pvVar4 = refRpsIdx;
  return 0;
}

Assistant:

int HevcSpsUnit::short_term_ref_pic_set(const unsigned stRpsIdx)
{
    unsigned numDeltaPocs = 0;
    const bool inter_ref_pic_set_prediction_flag = stRpsIdx && m_reader.getBit();

    if (inter_ref_pic_set_prediction_flag)
    {
        unsigned refRpsIdx = stRpsIdx - 1;

        if (stRpsIdx == num_short_term_ref_pic_sets)
        {
            const unsigned delta_idx_minus1 = extractUEGolombCode();
            if (delta_idx_minus1 >= stRpsIdx)
                return 1;
            refRpsIdx -= delta_idx_minus1;
        }

        m_reader.skipBit();     // delta_rps_sign
        extractUEGolombCode();  // abs_delta_rps_minus1

        for (unsigned j = 0; j <= num_delta_pocs[refRpsIdx]; j++)
        {
            const bool used = m_reader.getBit();                          // used_by_curr_pic_flag[j]
            const bool use_delta_flag = used ? true : m_reader.getBit();  // use_delta_flag[j]
            if (use_delta_flag)
                numDeltaPocs++;
        }
    }
    else
    {
        // numDeltaPocs = num_negative_pics + num_positive_pics
        numDeltaPocs = extractUEGolombCode() + extractUEGolombCode();
        if (numDeltaPocs > 64)
            return 1;

        for (unsigned i = 0; i < numDeltaPocs; i++)
        {
            if (extractUEGolombCode() >= 0x8000)  // delta_poc_minus1[i]
                return 1;
            m_reader.skipBit();  // used_by_curr_pic_flag[i]
        }
    }
    num_delta_pocs[stRpsIdx] = numDeltaPocs;

    return 0;
}